

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O0

string * __thiscall
t_perl_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_perl_generator *this,t_field *tfield,bool init,bool obj)

{
  uint uVar1;
  int iVar2;
  string *__rhs;
  t_type *type_00;
  t_program *p;
  undefined4 extraout_var;
  undefined1 auVar3 [12];
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_81;
  string local_80;
  t_base local_60;
  t_base tbase;
  t_base_type *local_50;
  t_type *type;
  string result;
  bool obj_local;
  bool init_local;
  t_field *tfield_local;
  t_perl_generator *this_local;
  
  result.field_2._M_local_buf[0xe] = obj;
  result.field_2._M_local_buf[0xf] = init;
  __rhs = t_field::get_name_abi_cxx11_(tfield);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,"my $",
                 __rhs);
  if ((result.field_2._M_local_buf[0xf] & 1U) != 0) {
    type_00 = t_field::get_type(tfield);
    local_50 = (t_base_type *)t_generator::get_true_type(type_00);
    uVar1 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[5])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[10])();
      if ((uVar1 & 1) == 0) {
        uVar1 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[0xd])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[0xb])();
          if (((uVar1 & 1) != 0) ||
             (uVar1 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar1 & 1) != 0))
          {
            if ((result.field_2._M_local_buf[0xe] & 1U) == 0) {
              std::__cxx11::string::operator+=((string *)&type," = undef");
            }
            else {
              p = t_type::get_program(&local_50->super_t_type);
              perl_namespace_abi_cxx11_(&local_108,this,p);
              std::operator+(&local_e8," = ",&local_108);
              iVar2 = (*(local_50->super_t_type).super_t_doc._vptr_t_doc[3])();
              std::operator+(&local_c8,&local_e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(extraout_var,iVar2));
              std::operator+(&local_a8,&local_c8,"->new()");
              std::__cxx11::string::operator+=((string *)&type,(string *)&local_a8);
              std::__cxx11::string::~string((string *)&local_a8);
              std::__cxx11::string::~string((string *)&local_c8);
              std::__cxx11::string::~string((string *)&local_e8);
              std::__cxx11::string::~string((string *)&local_108);
            }
          }
        }
        else {
          std::__cxx11::string::operator+=((string *)&type," = []");
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)&type," = 0");
      }
    }
    else {
      local_60 = t_base_type::get_base(local_50);
      switch(local_60) {
      case TYPE_VOID:
        break;
      case TYPE_STRING:
        std::__cxx11::string::operator+=((string *)&type," = \'\'");
        break;
      case TYPE_BOOL:
        std::__cxx11::string::operator+=((string *)&type," = 0");
        break;
      case TYPE_I8:
      case TYPE_I16:
      case TYPE_I32:
      case TYPE_I64:
        std::__cxx11::string::operator+=((string *)&type," = 0");
        break;
      case TYPE_DOUBLE:
        std::__cxx11::string::operator+=((string *)&type," = 0.0");
        break;
      default:
        local_81 = 1;
        auVar3 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_80,(t_base_type *)(ulong)local_60,auVar3._8_4_);
        std::operator+(auVar3._0_8_,"compiler error: no PERL initializer for base type ",&local_80);
        local_81 = 0;
        __cxa_throw(auVar3._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,";");
  std::__cxx11::string::~string((string *)&type);
  return __return_storage_ptr__;
}

Assistant:

string t_perl_generator::declare_field(t_field* tfield, bool init, bool obj) {
  string result = "my $" + tfield->get_name();
  if (init) {
    t_type* type = get_true_type(tfield->get_type());
    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        break;
      case t_base_type::TYPE_STRING:
        result += " = ''";
        break;
      case t_base_type::TYPE_BOOL:
        result += " = 0";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = 0.0";
        break;
      default:
        throw "compiler error: no PERL initializer for base type "
            + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      result += " = 0";
    } else if (type->is_container()) {
      result += " = []";
    } else if (type->is_struct() || type->is_xception()) {
      if (obj) {
        result += " = " + perl_namespace(type->get_program()) + type->get_name() + "->new()";
      } else {
        result += " = undef";
      }
    }
  }
  return result + ";";
}